

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,FormattedNumber *FN)

{
  uint *puVar1;
  size_t __n;
  uint64_t N;
  uint NumSpaces;
  undefined8 in_R9;
  Optional<unsigned_long> Width;
  undefined1 local_70 [8];
  raw_svector_ostream Stream;
  SmallString<16U> Buffer;
  
  if (FN->Hex != true) {
    puVar1 = &Buffer.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.Size;
    Buffer.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = (void *)0x1000000000;
    Stream.OS = (SmallVectorImpl<char> *)puVar1;
    raw_svector_ostream::raw_svector_ostream
              ((raw_svector_ostream *)local_70,(SmallVectorImpl<char> *)&Stream.OS);
    __n = 0;
    write_integer((raw_ostream *)local_70,FN->DecValue,0,Integer);
    NumSpaces = FN->Width -
                (uint)Buffer.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                      super_SmallVectorTemplateBase<char,_true>.
                      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    if ((uint)Buffer.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.BeginX <= FN->Width && NumSpaces != 0) {
      indent(this,NumSpaces);
    }
    write(this,(int)Stream.OS,
          (void *)((ulong)Buffer.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                          super_SmallVectorTemplateBase<char,_true>.
                          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX &
                  0xffffffff),__n);
    ~raw_ostream((raw_ostream *)local_70);
    if (Stream.OS == (SmallVectorImpl<char> *)puVar1) {
      return this;
    }
    free(Stream.OS);
    return this;
  }
  if (FN->Upper == true) {
    N = 2;
    if ((FN->HexPrefix != false) || (N = 0, FN->HexPrefix != true)) goto LAB_00db4c31;
  }
  else {
    N = 3;
    if (FN->HexPrefix != false) goto LAB_00db4c31;
  }
  N = 1;
LAB_00db4c31:
  Width.Storage._8_8_ = in_R9;
  Width.Storage.field_0.value = 1;
  llvm::write_hex((llvm *)this,(raw_ostream *)FN->HexValue,N,FN->Width,Width);
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const FormattedNumber &FN) {
  if (FN.Hex) {
    HexPrintStyle Style;
    if (FN.Upper && FN.HexPrefix)
      Style = HexPrintStyle::PrefixUpper;
    else if (FN.Upper && !FN.HexPrefix)
      Style = HexPrintStyle::Upper;
    else if (!FN.Upper && FN.HexPrefix)
      Style = HexPrintStyle::PrefixLower;
    else
      Style = HexPrintStyle::Lower;
    llvm::write_hex(*this, FN.HexValue, Style, FN.Width);
  } else {
    llvm::SmallString<16> Buffer;
    llvm::raw_svector_ostream Stream(Buffer);
    llvm::write_integer(Stream, FN.DecValue, 0, IntegerStyle::Integer);
    if (Buffer.size() < FN.Width)
      indent(FN.Width - Buffer.size());
    (*this) << Buffer;
  }
  return *this;
}